

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SphereRecord2.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::SphereRecord2::Decode(SphereRecord2 *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  allocator<char> local_39;
  KString local_38;
  KDataStream *local_18;
  KDataStream *stream_local;
  SphereRecord2 *this_local;
  
  local_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  if (KVar1 < 0x40) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
    KException::KException(this_00,&local_38,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  pKVar2 = KDataStream::operator>>
                     (local_18,&(this->super_SphereRecord1).super_BoundingSphereRecord.
                                super_EnvironmentRecord.m_ui32EnvRecTyp);
  pKVar2 = KDataStream::operator>>
                     (pKVar2,&(this->super_SphereRecord1).super_BoundingSphereRecord.
                              super_EnvironmentRecord.m_ui16Length);
  pKVar2 = KDataStream::operator>>
                     (pKVar2,&(this->super_SphereRecord1).super_BoundingSphereRecord.
                              super_EnvironmentRecord.m_ui8Index);
  pKVar2 = KDataStream::operator>>
                     (pKVar2,&(this->super_SphereRecord1).super_BoundingSphereRecord.
                              super_EnvironmentRecord.m_ui8Padding);
  pKVar2 = operator>>(pKVar2,&(this->super_SphereRecord1).super_BoundingSphereRecord.m_CentLocation.
                              super_DataTypeBase);
  pKVar2 = KDataStream::operator>>
                     (pKVar2,(float *)&(this->super_SphereRecord1).super_BoundingSphereRecord.
                                       m_f32Rad);
  pKVar2 = KDataStream::operator>>(pKVar2,(float *)&this->m_f32ddt);
  pKVar2 = operator>>(pKVar2,&(this->m_Velocity).super_DataTypeBase);
  operator>>(pKVar2,&(this->m_AngularVelocity).super_DataTypeBase);
  return;
}

Assistant:

void SphereRecord2::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < SPHERE_RECORD_2_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_ui32EnvRecTyp
           >> m_ui16Length
           >> m_ui8Index
           >> m_ui8Padding
           >> KDIS_STREAM m_CentLocation
           >> m_f32Rad
           >> m_f32ddt
           >> KDIS_STREAM m_Velocity
           >> KDIS_STREAM m_AngularVelocity;
}